

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Writer::InitParameters(BP3Writer *this)

{
  BP3Serializer *pBVar1;
  IO *pIVar2;
  _func_int *p_Var3;
  size_t dataIn;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pBVar1 = &this->m_BP3Serializer;
  pIVar2 = (this->super_Engine).m_IO;
  p_Var3 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  std::__cxx11::string::string((string *)&local_38,"in call to BP3::Open for writing",&local_7a);
  std::__cxx11::string::string((string *)&local_58,"",&local_79);
  adios2::format::BPBase::Init
            ((BPBase *)((long)&(pBVar1->super_BP3Base)._vptr_BP3Base + (long)p_Var3),
             &pIVar2->m_Parameters,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  p_Var3 = (pBVar1->super_BP3Base)._vptr_BP3Base[-3];
  dataIn = *(size_t *)(p_Var3 + 0x208 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
  std::__cxx11::string::string((string *)&local_78,"in call to BP3::Open to write",&local_7a);
  adios2::format::BPBase::ResizeBuffer
            ((BPBase *)((long)&(pBVar1->super_BP3Base)._vptr_BP3Base + (long)p_Var3),dataIn,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}